

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_var_to_local.cpp
# Opt level: O0

void __thiscall
optimization::global_var_to_local::Global_Var_to_Local::optimize_mir
          (Global_Var_to_Local *this,MirPackage *mir,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data_repo)

{
  bool bVar1;
  __type_conflict _Var2;
  int iVar3;
  element_type *peVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  pointer ppVar8;
  reference pbVar9;
  ulong uVar10;
  size_type sVar11;
  pointer pIVar12;
  char *pcVar13;
  size_type sVar14;
  Var_Replace *this_00;
  VarId *from;
  VarId *to;
  ostream *poVar15;
  mapped_type *pmVar16;
  int __c;
  uint extraout_EDX;
  long in_RSI;
  _Self *__y;
  pointer_____offset_0x10___ *__s;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar17;
  undefined1 auVar18 [12];
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *def_1;
  LoadOffsetInst *ist_1;
  Inst *i_2;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *def;
  VarId val;
  StoreOffsetInst *ist;
  Inst *i_1;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst_1;
  pair<int,_int> *usepoint;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  Var_Replace vp;
  VarId var;
  RefInst *ref;
  Inst *i;
  value_type *inst;
  int idx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  iterator __end2_2;
  iterator __begin2_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_2;
  VarId dest;
  BasicBlk *startblk;
  mapped_type *f;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>
  *f_1;
  iterator __end2_1;
  iterator __begin2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  *__range2_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
  *p;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
  *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  global_vars;
  Var_Replace *in_stack_fffffffffffff9c8;
  pair<int,_int> in_stack_fffffffffffff9d0;
  const_iterator in_stack_fffffffffffff9d8;
  Function *in_stack_fffffffffffff9e0;
  key_type *in_stack_fffffffffffff9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f0;
  Function *in_stack_fffffffffffff9f8;
  allocator<char> *in_stack_fffffffffffffa00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa10;
  Value *in_stack_fffffffffffffa20;
  VarId *in_stack_fffffffffffffa28;
  VarId *in_stack_fffffffffffffa30;
  VarId *in_stack_fffffffffffffa38;
  VarId *in_stack_fffffffffffffa40;
  VarId *in_stack_fffffffffffffa48;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa50;
  MirFunction *in_stack_fffffffffffffa58;
  Variable *in_stack_fffffffffffffa60;
  undefined7 in_stack_fffffffffffffa68;
  undefined1 in_stack_fffffffffffffa6f;
  undefined8 local_590;
  ostream *in_stack_fffffffffffffac8;
  ostream *in_stack_fffffffffffffad0;
  MirFunction *in_stack_fffffffffffffb38;
  Var_Replace *in_stack_fffffffffffffb40;
  undefined1 local_430 [24];
  key_type local_418;
  _func_int **local_3f0;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_3e8;
  undefined1 local_3e0 [24];
  VarId local_3c8;
  VarId local_3b8;
  undefined8 local_3a8;
  type local_3a0;
  pair<int,_int> local_398;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_390;
  reference local_388;
  pair<int,_int> *local_380;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_378;
  mapped_type *local_370;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_300;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_2e8;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_2e0;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_2d8;
  allocator<char> local_2c1;
  string local_2c0 [39];
  allocator<char> local_299;
  string local_298 [120];
  time_point_sys_clock local_220;
  Timestamp local_218 [3];
  undefined1 local_1c9;
  MirFunction *local_178;
  Var_Replace *local_170;
  reference local_168;
  int local_15c;
  string local_158 [32];
  _Self local_138;
  _Self local_130;
  undefined1 *local_128;
  _Base_ptr local_110;
  BasicBlk *local_108;
  allocator<char> local_f9;
  string local_f8 [32];
  mapped_type *local_d8;
  undefined4 local_d0;
  allocator<char> local_c9;
  string local_c8 [32];
  reference local_a8;
  _Self local_a0;
  _Self local_98;
  long local_90;
  _Base_ptr local_88;
  undefined1 local_80;
  reference local_68;
  _Self local_60;
  _Self local_58;
  long local_50;
  undefined1 local_48 [56];
  long local_10;
  
  local_10 = in_RSI;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x1f3c9c);
  local_50 = local_10 + 0x38;
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
                *)in_stack_fffffffffffff9c8);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
              *)in_stack_fffffffffffff9c8);
  while( true ) {
    __y = &local_60;
    bVar1 = std::operator!=(&local_58,__y);
    if (!bVar1) break;
    local_68 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>
                            *)0x1f3d05);
    pcVar13 = std::
              variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::index((variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&(local_68->second).field_0x8,(char *)__y,__c);
    if (pcVar13 == (char *)0x0) {
      pVar17 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
      local_88 = (_Base_ptr)pVar17.first._M_node;
      local_80 = pVar17.second;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>
                  *)in_stack_fffffffffffff9d0);
  }
  local_90 = local_10 + 8;
  local_98._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                *)in_stack_fffffffffffff9c8);
  local_a0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
              *)in_stack_fffffffffffff9c8);
  while (bVar1 = std::operator!=(&local_98,&local_a0), bVar1) {
    local_a8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                            *)0x1f3e04);
    peVar4 = std::
             __shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1f3e21);
    if ((((peVar4->is_extern & 1U) == 0) &&
        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8),
        !bVar1)) &&
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8),
       !bVar1)) {
      optimize_func((Global_Var_to_Local *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                    in_stack_fffffffffffffa50);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                  *)in_stack_fffffffffffff9d0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                   *)in_stack_fffffffffffff9e0,(key_type *)in_stack_fffffffffffff9d8._M_current);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  if (sVar5 == 0) {
    local_d0 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00
              );
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
             ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                   *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator(&local_f9);
    local_d8 = pmVar6;
    sVar7 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::size((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                    *)0x1f4053);
    if (sVar7 == 0) {
      local_d0 = 1;
    }
    else {
      local_110 = (_Base_ptr)
                  std::
                  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                           *)in_stack_fffffffffffff9c8);
      ppVar8 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x1f40d8)
      ;
      local_108 = &ppVar8->second;
      ::mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffff9d0);
      local_128 = local_48;
      local_130._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff9c8);
      local_138._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff9c8);
      while (bVar1 = std::operator!=(&local_130,&local_138), bVar1) {
        pbVar9 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)0x1f4158);
        std::__cxx11::string::string(local_158,(string *)pbVar9);
        for (local_15c = 0; uVar10 = (ulong)local_15c,
            sVar11 = std::
                     vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                     ::size(&local_108->inst), uVar10 < sVar11; local_15c = local_15c + 1) {
          __s = (pointer_____offset_0x10___ *)(long)local_15c;
          local_168 = std::
                      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ::at((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                            *)in_stack_fffffffffffff9d0,(size_type)in_stack_fffffffffffff9c8);
          local_170 = (Var_Replace *)
                      std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                      operator*((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                 *)in_stack_fffffffffffff9d0);
          pIVar12 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                    operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *
                               )0x1f4211);
          iVar3 = (*(pIVar12->super_Displayable)._vptr_Displayable[1])();
          if (iVar3 == 2) {
            in_stack_fffffffffffffb40 = local_170;
            if (local_170 == (Var_Replace *)0x0) {
              auVar18._4_8_ = 0;
              auVar18._0_4_ = extraout_EDX;
              auVar18 = auVar18 << 0x40;
            }
            else {
              __s = &::mir::inst::Inst::typeinfo;
              auVar18 = __dynamic_cast(local_170,&::mir::inst::Inst::typeinfo,
                                       &::mir::inst::RefInst::typeinfo,0);
            }
            in_stack_fffffffffffffb38 = auVar18._0_8_;
            local_178 = in_stack_fffffffffffffb38;
            pcVar13 = std::
                      variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::index((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&(in_stack_fffffffffffffb38->name).field_2,(char *)__s,
                              auVar18._8_4_);
            if (pcVar13 == (char *)0x1) {
              std::get<std::__cxx11::string,mir::inst::VarId,std::__cxx11::string>
                        ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x1f42d2);
              _Var2 = std::operator==(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
              if (_Var2) {
                ::mir::inst::VarId::operator=
                          ((VarId *)in_stack_fffffffffffff9d0,(VarId *)in_stack_fffffffffffff9c8);
                break;
              }
            }
          }
        }
        sVar11 = (size_type)local_15c;
        sVar14 = std::
                 vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ::size(&local_108->inst);
        if (sVar11 == sVar14) {
          local_d0 = 7;
        }
        else {
          ::mir::types::new_int_ty();
          std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                    ((shared_ptr<mir::types::Ty> *)in_stack_fffffffffffff9d0,
                     (shared_ptr<mir::types::IntTy> *)in_stack_fffffffffffff9c8);
          ::mir::inst::Variable::Variable
                    ((Variable *)in_stack_fffffffffffff9e0,
                     (SharedTyPtr *)in_stack_fffffffffffff9d8._M_current,
                     in_stack_fffffffffffff9d0.second._3_1_,in_stack_fffffffffffff9d0.second._2_1_,
                     in_stack_fffffffffffff9d0.second._1_1_);
          get_new_id((MirFunction *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),
                     in_stack_fffffffffffffa60);
          ::mir::inst::Variable::~Variable((Variable *)0x1f43f5);
          std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x1f4402);
          std::shared_ptr<mir::types::IntTy>::~shared_ptr((shared_ptr<mir::types::IntTy> *)0x1f440f)
          ;
          local_1c9 = 0;
          this_00 = (Var_Replace *)
                    AixLog::operator<<(in_stack_fffffffffffffad0,
                                       (Severity *)in_stack_fffffffffffffac8);
          AixLog::Tag::Tag((Tag *)0x1f4442);
          from = (VarId *)AixLog::operator<<((ostream *)in_stack_fffffffffffffa00,
                                             (Tag *)in_stack_fffffffffffff9f8);
          local_220.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          AixLog::Timestamp::Timestamp(local_218,&local_220);
          to = (VarId *)AixLog::operator<<((ostream *)in_stack_fffffffffffffa60,
                                           (Timestamp *)in_stack_fffffffffffffa58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,
                     in_stack_fffffffffffffa00);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,
                     in_stack_fffffffffffffa00);
          AixLog::Function::Function
                    (in_stack_fffffffffffff9e0,(string *)in_stack_fffffffffffff9d8._M_current,
                     (string *)in_stack_fffffffffffff9d0,(size_t)in_stack_fffffffffffff9c8);
          poVar15 = AixLog::operator<<((ostream *)in_stack_fffffffffffffa00,
                                       in_stack_fffffffffffff9f8);
          poVar15 = std::operator<<(poVar15,"convert global var  ");
          poVar15 = std::operator<<(poVar15,local_158);
          in_stack_fffffffffffffad0 = std::operator<<(poVar15," to local var ");
          in_stack_fffffffffffffac8 =
               prelude::operator<<((ostream *)in_stack_fffffffffffff9d0,
                                   (Displayable *)in_stack_fffffffffffff9c8);
          poVar15 = std::operator<<(in_stack_fffffffffffffac8," in ");
          poVar15 = std::operator<<(poVar15,(string *)&local_d8->name);
          std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
          AixLog::Function::~Function((Function *)in_stack_fffffffffffff9d0);
          std::__cxx11::string::~string(local_2c0);
          std::allocator<char>::~allocator(&local_2c1);
          std::__cxx11::string::~string(local_298);
          std::allocator<char>::~allocator(&local_299);
          AixLog::Timestamp::~Timestamp(local_218);
          AixLog::Tag::~Tag((Tag *)0x1f467b);
          local_2e8 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                      std::
                      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                               *)in_stack_fffffffffffff9c8);
          local_2e0 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                      __gnu_cxx::
                      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                      ::operator+((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                   *)in_stack_fffffffffffff9d8._M_current,
                                  (difference_type)in_stack_fffffffffffff9d0);
          local_2d8 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                      __gnu_cxx::
                      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                      ::operator+((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                   *)in_stack_fffffffffffff9d8._M_current,
                                  (difference_type)in_stack_fffffffffffff9d0);
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>const*,std::vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>>
          ::
          __normal_iterator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>*>
                    ((__normal_iterator<const_std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                      *)in_stack_fffffffffffff9d0,
                     (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                      *)in_stack_fffffffffffff9c8);
          std::make_unique<mir::inst::LoadInst,mir::inst::VarId&,mir::inst::VarId&>
                    (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
          std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
          unique_ptr<mir::inst::LoadInst,std::default_delete<mir::inst::LoadInst>,void>
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     in_stack_fffffffffffff9e0,
                     (unique_ptr<mir::inst::LoadInst,_std::default_delete<mir::inst::LoadInst>_> *)
                     in_stack_fffffffffffff9d8._M_current);
          local_300 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                      std::
                      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ::insert((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9d8,
                               (value_type *)in_stack_fffffffffffff9c8);
          std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     in_stack_fffffffffffff9e0);
          std::unique_ptr<mir::inst::LoadInst,_std::default_delete<mir::inst::LoadInst>_>::
          ~unique_ptr((unique_ptr<mir::inst::LoadInst,_std::default_delete<mir::inst::LoadInst>_> *)
                      in_stack_fffffffffffff9d0);
          var_replace::Var_Replace::Var_Replace(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38)
          ;
          local_370 = std::
                      map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                      ::at((map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                            *)in_stack_fffffffffffff9f0,(key_type *)in_stack_fffffffffffff9e8);
          local_378._M_current =
               (pair<int,_int> *)
               std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          in_stack_fffffffffffff9c8);
          local_380 = (pair<int,_int> *)
                      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  *)in_stack_fffffffffffff9c8);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                     *)in_stack_fffffffffffff9d0,
                                    (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                     *)in_stack_fffffffffffff9c8), bVar1) {
            local_388 = __gnu_cxx::
                        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        ::operator*(&local_378);
            if ((local_388->first != local_108->id) || (local_388->second != local_15c + 1)) {
              local_398 = *local_388;
              local_390 = var_replace::Var_Replace::get_usepoint
                                    (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9d0);
              pIVar12 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                        operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                    *)0x1f4a3b);
              iVar3 = (*(pIVar12->super_Displayable)._vptr_Displayable[1])();
              if (iVar3 == 4) {
                local_3a0 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                            ::operator*((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                         *)in_stack_fffffffffffff9d0);
                if (local_3a0 == (type)0x0) {
                  local_590 = 0;
                }
                else {
                  local_590 = __dynamic_cast(local_3a0,&::mir::inst::Inst::typeinfo,
                                             &::mir::inst::StoreOffsetInst::typeinfo,0);
                }
                local_3a8 = local_590;
                in_stack_fffffffffffffa6f = ::mir::inst::Value::is_immediate((Value *)0x1f4af3);
                if (!(bool)in_stack_fffffffffffffa6f) {
                  in_stack_fffffffffffffa58 = (MirFunction *)&local_d8->variables;
                  in_stack_fffffffffffffa60 =
                       (Variable *)
                       std::get<mir::inst::VarId,int,mir::inst::VarId>
                                 ((variant<int,_mir::inst::VarId> *)0x1f4b32);
                  pmVar16 = std::
                            map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                            ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  *)in_stack_fffffffffffff9f0,
                                 (key_type_conflict *)in_stack_fffffffffffff9e8);
                  if ((pmVar16->is_phi_var & 1U) == 0) {
                    in_stack_fffffffffffffa48 =
                         std::get<mir::inst::VarId,int,mir::inst::VarId>
                                   ((variant<int,_mir::inst::VarId> *)0x1f4b82);
                    in_stack_fffffffffffffa30 = &local_3b8;
                    ::mir::inst::VarId::VarId
                              ((VarId *)in_stack_fffffffffffff9d0,(VarId *)in_stack_fffffffffffff9c8
                              );
                    in_stack_fffffffffffffa38 = &local_3c8;
                    ::mir::inst::VarId::VarId
                              ((VarId *)in_stack_fffffffffffff9d0,(VarId *)in_stack_fffffffffffff9c8
                              );
                    in_stack_fffffffffffffa40 = (VarId *)(local_3e0 + 8);
                    ::mir::inst::VarId::VarId
                              ((VarId *)in_stack_fffffffffffff9d0,(VarId *)in_stack_fffffffffffff9c8
                              );
                    var_replace::Var_Replace::replace(this_00,from,to);
                    std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::VarId&>
                              (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
                    in_stack_fffffffffffffa20 = (Value *)local_3e0;
                    std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::operator=
                              ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *
                               )in_stack_fffffffffffff9e0,
                               (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                                *)in_stack_fffffffffffff9d8._M_current);
                    std::
                    unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
                    ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                                 *)in_stack_fffffffffffff9d0);
                    in_stack_fffffffffffffa28 =
                         (VarId *)std::
                                  map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                                  ::at((map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                                        *)in_stack_fffffffffffff9f0,
                                       (key_type *)in_stack_fffffffffffff9e8);
                    local_3f0 = (in_stack_fffffffffffffa28->super_Displayable)._vptr_Displayable;
                    local_3e8 = var_replace::Var_Replace::get_usepoint
                                          (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9d0);
                    std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                    operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *
                               )0x1f4c90);
                    ::mir::inst::VarId::operator=
                              ((VarId *)in_stack_fffffffffffff9d0,(VarId *)in_stack_fffffffffffff9c8
                              );
                    goto LAB_001f4ee4;
                  }
                }
                std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value&>
                          (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
                std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::operator=
                          ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           in_stack_fffffffffffff9e0,
                           (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                            *)in_stack_fffffffffffff9d8._M_current);
                std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                ::~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                               *)in_stack_fffffffffffff9d0);
              }
              else {
                in_stack_fffffffffffffa08 =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                     operator*((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *
                               )in_stack_fffffffffffff9d0);
                in_stack_fffffffffffffa10 = in_stack_fffffffffffffa08;
                local_418.field_2._8_8_ = in_stack_fffffffffffffa08;
                if (in_stack_fffffffffffffa08 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  in_stack_fffffffffffffa00 = (allocator<char> *)0x0;
                }
                else {
                  in_stack_fffffffffffffa00 =
                       (allocator<char> *)
                       __dynamic_cast(in_stack_fffffffffffffa08,&::mir::inst::Inst::typeinfo,
                                      &::mir::inst::LoadOffsetInst::typeinfo,0);
                }
                local_418.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffa00;
                in_stack_fffffffffffff9f8 =
                     (Function *)
                     std::
                     map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                     ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                           *)in_stack_fffffffffffff9f0,
                          (key_type_conflict *)in_stack_fffffffffffff9e8);
                if (((in_stack_fffffffffffff9f8->name).field_2._M_local_buf[2] & 1U) == 0) {
                  in_stack_fffffffffffff9e8 = &local_418;
                  ::mir::inst::VarId::VarId
                            ((VarId *)in_stack_fffffffffffff9d0,(VarId *)in_stack_fffffffffffff9c8);
                  in_stack_fffffffffffff9f0 =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_430 + 8);
                  ::mir::inst::VarId::VarId
                            ((VarId *)in_stack_fffffffffffff9d0,(VarId *)in_stack_fffffffffffff9c8);
                  var_replace::Var_Replace::replace(this_00,from,to);
                  std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::VarId&>
                            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
                  in_stack_fffffffffffff9d8._M_current =
                       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                       local_430;
                  std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::operator=
                            ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                             in_stack_fffffffffffff9e0,
                             (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                              *)in_stack_fffffffffffff9d8._M_current);
                  std::
                  unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
                  ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                               *)in_stack_fffffffffffff9d0);
                  in_stack_fffffffffffff9e0 =
                       (Function *)
                       std::
                       map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                       ::at((map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                             *)in_stack_fffffffffffff9f0,(key_type *)in_stack_fffffffffffff9e8);
                  in_stack_fffffffffffff9d0 =
                       (pair<int,_int>)
                       var_replace::Var_Replace::get_usepoint
                                 (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9d0);
                  std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                  operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                             0x1f4e85);
                  ::mir::inst::VarId::operator=
                            ((VarId *)in_stack_fffffffffffff9d0,(VarId *)in_stack_fffffffffffff9c8);
                }
                else {
                  std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::VarId&>
                            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
                  std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::operator=
                            ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                             in_stack_fffffffffffff9e0,
                             (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                              *)in_stack_fffffffffffff9d8._M_current);
                  std::
                  unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
                  ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                               *)in_stack_fffffffffffff9d0);
                }
              }
            }
LAB_001f4ee4:
            __gnu_cxx::
            __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
            ::operator++(&local_378);
          }
          var_replace::Var_Replace::~Var_Replace((Var_Replace *)in_stack_fffffffffffff9d0);
          local_d0 = 0;
        }
        std::__cxx11::string::~string(local_158);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffff9d0);
      }
      local_d0 = 0;
    }
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1f4f65);
  return;
}

Assistant:

void Global_Var_to_Local::optimize_mir(
    mir::inst::MirPackage& mir,
    std::map<std::string, std::any>& extra_data_repo) {
  std::set<std::string> global_vars;
  for (auto& p : mir.global_values) {
    if (p.second.index() == 0) {
      global_vars.insert(p.first);
    }
  }
  for (auto& f : mir.functions) {
    if (f.second.type->is_extern || f.first == "$$5_main" || f.first == "main")
      continue;
    optimize_func(f.second, global_vars);
  }
  if (!mir.functions.count("$$5_main")) {
    return;
  }
  auto& f = mir.functions.at("$$5_main");
  if (!f.basic_blks.size()) {
    return;
  }
  auto& startblk = f.basic_blks.begin()->second;
  mir::inst::VarId dest;
  for (auto s : global_vars) {
    int idx = 0;
    for (; idx < startblk.inst.size(); idx++) {
      auto& inst = startblk.inst.at(idx);
      auto& i = *inst;
      if (inst->inst_kind() == mir::inst::InstKind::Ref) {
        auto ref = dynamic_cast<mir::inst::RefInst*>(&i);
        if (ref->val.index() == 1 && std::get<std::string>(ref->val) == s) {
          dest = ref->dest;
          break;
        }
      }
    }
    if (idx == startblk.inst.size()) {
      continue;
    }
    auto var = get_new_id(f, mir::inst::Variable(mir::types::new_int_ty()));
    LOG(TRACE) << "convert global var  " << s << " to local var " << var
               << " in " << f.name << std::endl;
    startblk.inst.insert(startblk.inst.begin() + idx + 1,
                         std::make_unique<mir::inst::LoadInst>(dest, var));
    var_replace::Var_Replace vp(f);
    for (auto& usepoint : vp.usepoints.at(dest)) {
      if (usepoint.first == startblk.id && usepoint.second == idx + 1) {
        continue;
      }
      auto& inst = vp.get_usepoint(usepoint);
      if (inst->inst_kind() == mir::inst::InstKind::Store) {
        auto& i = *inst;
        auto ist = dynamic_cast<mir::inst::StoreOffsetInst*>(&i);
        if (!ist->val.is_immediate() &&
            !f.variables.at(std::get<mir::inst::VarId>(ist->val).id)
                 .is_phi_var) {
          auto val = std::get<mir::inst::VarId>(ist->val);
          vp.replace(val, var);
          inst = std::make_unique<mir::inst::AssignInst>(var, var);
          auto& def = vp.get_usepoint(vp.defpoint.at(val));
          def->dest = var;
        } else {
          inst = std::make_unique<mir::inst::AssignInst>(var, ist->val);
        }
      } else {
        auto& i = *inst;
        auto ist = dynamic_cast<mir::inst::LoadOffsetInst*>(&i);
        if (!f.variables.at(ist->dest.id).is_phi_var) {
          vp.replace(ist->dest, var);
          inst = std::make_unique<mir::inst::AssignInst>(var, var);
          auto& def = vp.get_usepoint(vp.defpoint.at(ist->dest));
          def->dest = var;
        } else {
          inst = std::make_unique<mir::inst::AssignInst>(ist->dest, var);
        }
      }
    }
  }
}